

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int decompose_f3_ext_stem_d0
              (vrna_fold_compound_t *fc,int i,vrna_callback_hc_evaluate *evaluate,
              default_data *hc_dat_local,sc_wrapper_f3 *sc_wrapper)

{
  uint uVar1;
  int iVar2;
  int *stems_00;
  int local_60;
  int local_5c;
  int length;
  int maxdist;
  int *stems;
  int e;
  sc_wrapper_f3 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int i_local;
  vrna_fold_compound_t *fc_local;
  
  uVar1 = fc->length;
  iVar2 = fc->window_size;
  stems_00 = f3_get_stem_contributions_d0(fc,i,evaluate,hc_dat_local,sc_wrapper);
  if ((int)(uVar1 - 1) < i + iVar2) {
    local_5c = uVar1 - 1;
  }
  else {
    local_5c = i + iVar2;
  }
  local_60 = decompose_f3_ext_stem(fc,i,local_5c,stems_00);
  stems._4_4_ = local_60;
  if ((int)uVar1 <= i + iVar2) {
    if (stems_00[(int)uVar1] <= local_60) {
      local_60 = stems_00[(int)uVar1];
    }
    stems._4_4_ = local_60;
  }
  free(stems_00 + i);
  return stems._4_4_;
}

Assistant:

int
decompose_f3_ext_stem_d0(vrna_fold_compound_t       *fc,
                         int                        i,
                         vrna_callback_hc_evaluate  *evaluate,
                         struct default_data        *hc_dat_local,
                         struct sc_wrapper_f3       *sc_wrapper)
{
  int e, *stems, maxdist, length;

  length  = (int)fc->length;
  maxdist = fc->window_size;

  stems = f3_get_stem_contributions_d0(fc, i, evaluate, hc_dat_local, sc_wrapper);

  /* 1st case, actual decompostion */
  e = decompose_f3_ext_stem(fc, i, MIN2(length - 1, i + maxdist), stems);

  /* 2nd case, reduce to single stem */
  if (length <= i + maxdist)
    e = MIN2(e, stems[length]);

  stems += i;
  free(stems);

  return e;
}